

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

void InitConformal(void)

{
  int iVar1;
  ulong uVar2;
  vector<Blade,_std::allocator<Blade>_> local_1e8;
  vector<Blade,_std::allocator<Blade>_> local_1d0;
  Clifford local_1b8;
  Clifford local_1a0;
  vector<Blade,_std::allocator<Blade>_> local_188;
  vector<Blade,_std::allocator<Blade>_> local_170;
  Clifford local_158;
  Blade *local_140;
  Blade local_138;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_130;
  const_iterator local_128;
  Blade *local_120;
  Blade local_118;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_110;
  const_iterator local_108;
  Blade *local_100;
  Blade local_f8;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_f0;
  const_iterator local_e8;
  Blade *local_e0;
  Blade local_d8;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_d0;
  const_iterator local_c8;
  Blade *local_c0;
  Blade local_b8;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_b0;
  const_iterator local_a8;
  Blade *local_a0;
  Blade local_98;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_90;
  const_iterator local_88;
  Blade *local_80;
  Blade local_78;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_70;
  const_iterator local_68;
  Blade *local_60;
  Blade local_58;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_50;
  const_iterator local_48;
  Blade *local_40;
  Blade local_28;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_20;
  const_iterator local_18;
  int local_10;
  int local_c;
  int b;
  int a;
  
  tp = 4;
  tq = 1;
  dim = 0x20;
  uVar2 = SUB168(ZEXT816(0x20) * ZEXT816(4),0);
  if (SUB168(ZEXT816(0x20) * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  Re = (float *)operator_new__(uVar2);
  for (local_c = 0; local_c < dim; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < dim; local_10 = local_10 + 1) {
      iVar1 = sign2(local_c,local_10);
      signs[local_c][local_10] = iVar1;
    }
  }
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e0);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e1);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e2);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e3);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&e4);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&E);
  std::vector<Blade,_std::allocator<Blade>_>::clear(&Ic);
  local_20._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e0);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_18,
             &local_20);
  Blade::Blade(&local_28,0);
  local_40 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e0,local_18,&local_28);
  Blade::~Blade(&local_28);
  local_50._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e1);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_48,
             &local_50);
  Blade::Blade(&local_58,1);
  local_60 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e1,local_48,&local_58);
  Blade::~Blade(&local_58);
  local_70._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e2);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_68,
             &local_70);
  Blade::Blade(&local_78,2);
  local_80 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e2,local_68,&local_78);
  Blade::~Blade(&local_78);
  local_90._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e3);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_88,
             &local_90);
  Blade::Blade(&local_98,4);
  local_a0 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e3,local_88,&local_98);
  Blade::~Blade(&local_98);
  local_b0._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e4);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_a8,
             &local_b0);
  Blade::Blade(&local_b8,8);
  local_c0 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e4,local_a8,&local_b8);
  Blade::~Blade(&local_b8);
  local_d0._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&e5);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_c8,
             &local_d0);
  Blade::Blade(&local_d8,0x10);
  local_e0 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&e5,local_c8,&local_d8);
  Blade::~Blade(&local_d8);
  local_f0._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&Ie);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_e8,
             &local_f0);
  Blade::Blade(&local_f8,7);
  local_100 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&Ie,local_e8,&local_f8);
  Blade::~Blade(&local_f8);
  local_110._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&E);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_108,
             &local_110);
  Blade::Blade(&local_118,0x18);
  local_120 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&E,local_108,&local_118);
  Blade::~Blade(&local_118);
  local_130._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(&Ic);
  __gnu_cxx::__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>>::
  __normal_iterator<Blade*>
            ((__normal_iterator<Blade_const*,std::vector<Blade,std::allocator<Blade>>> *)&local_128,
             &local_130);
  Blade::Blade(&local_138,0x1f);
  local_140 = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::insert(&Ic,local_128,&local_138);
  Blade::~Blade(&local_138);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_170,&e4);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_188,&e5);
  operator+(&local_158,&local_170,&local_188);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&e,&local_158);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_158);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_188);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_170);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1d0,&e5);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1e8,&e4);
  operator-(&local_1b8,&local_1d0,&local_1e8);
  operator/(&local_1a0,&local_1b8,2.0);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(&eo,&local_1a0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1a0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1b8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1e8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1d0);
  return;
}

Assistant:

void InitConformal()
{
	//dimention of algebra
	tp=4; tq=1;dim=(1<<(tp+tq));
	Re=new float[dim];

	for(int a=0;a<dim;a++)
	{
		for(int b=0;b<dim;b++)
		{
			signs[a][b]=sign2(a,b);	
		}
		
	}
	//init basis
	e0.clear();
	e1.clear();
	e2.clear();
	e3.clear();
	e4.clear();
	Ie.clear();
	 E.clear();
	Ic.clear();
	e0.insert(e0.begin(),Blade(0));
	e1.insert(e1.begin(),Blade(1));
	e2.insert(e2.begin(),Blade(2));
	e3.insert(e3.begin(),Blade(4));
	e4.insert(e4.begin(),Blade(8));
	e5.insert(e5.begin(),Blade(16));
	Ie.insert(Ie.begin(),Blade(7));
	 E.insert( E.begin(),Blade(24));
	Ic.insert(Ic.begin(),Blade(31));
	
	e=e4+e5;
	eo=(e5-e4)/2.0;



}